

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O3

void __thiscall Catch::Capturer::captureValues<void*>(Capturer *this,size_t index,void **value)

{
  _Alloc_hider in_stack_ffffffffffffffc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  StringMaker<void_*,_void>::convert<void>(in_stack_ffffffffffffffc8._M_p);
  captureValue(this,index,(string *)&stack0xffffffffffffffc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffffc8._M_p != &local_28) {
    operator_delete(in_stack_ffffffffffffffc8._M_p,local_28._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }